

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O3

bool __thiscall
NumberTemp::IsTempPropertyTransferStore(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  NumberTemp *this_00;
  Type propertySym;
  ThreadContextInfo *pTVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  BOOLEAN BVar5;
  uint uVar6;
  SymID i;
  int iVar7;
  undefined4 *puVar8;
  char *this_01;
  
  bVar3 = BackwardPass::DoMarkTempNumbersOnTempObjects(backwardPass);
  if ((bVar3) && ((this->nonTempElemLoad & 1U) == 0)) {
    uVar6 = instr->m_opcode - 0x70;
    if ((10 < uVar6) || ((0x441U >> (uVar6 & 0x1f) & 1) == 0)) {
      if (instr->m_dst == (Opnd *)0x0) {
        return false;
      }
      if ((instr->m_dst->field_0xb & 0x10) == 0) {
        return false;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x2e5,"(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp())",
                         "instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp()");
      if (bVar3) {
        *puVar8 = 0;
        return false;
      }
LAB_006315cb:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    this_00 = (NumberTemp *)instr->m_dst;
    OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x2d4,"(dst->IsSymOpnd())","dst->IsSymOpnd()");
      if (!bVar3) goto LAB_006315cb;
      *puVar8 = 0;
    }
    if ((*(undefined1 *)
          ((long)((ValueType *)&(this_00->super_TempTrackerBase).nonTempSyms.lastFoundIndex + 1) + 1
          ) & 0x10) == 0) {
      return false;
    }
    this_01 = (char *)this_00;
    OVar4 = IR::Opnd::GetKind((Opnd *)this_00);
    if (OVar4 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      this_01 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar3) goto LAB_006315cb;
      *puVar8 = 0;
    }
    propertySym = (this_00->super_TempTrackerBase).nonTempSyms.alloc;
    if (*(SymKind *)
         ((long)&(propertySym->super_ArenaAllocator).
                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                 super_ArenaData.bigBlocks + 4) != SymKindProperty) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      this_01 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
      ;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
      if (!bVar3) goto LAB_006315cb;
      *puVar8 = 0;
    }
    i = GetRepresentativePropertySymId
                  ((NumberTemp *)this_01,(PropertySym *)propertySym,backwardPass);
    BVar5 = BVSparse<Memory::JitArenaAllocator>::Test((BVSparse<Memory::JitArenaAllocator> *)this,i)
    ;
    if (BVar5 == '\0') {
      pTVar1 = instr->m_func->m_threadContextInfo;
      iVar7 = (*pTVar1->_vptr_ThreadContextInfo[10])
                        (pTVar1,(ulong)*(uint *)&(propertySym->super_ArenaAllocator).
                                                 super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                                 .super_ArenaData.fullBlocks);
      return (bool)((byte)iVar7 ^ 1);
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempPropertyTransferStore(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::InitFld:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            {
                IR::Opnd * dst = instr->GetDst();
                Assert(dst->IsSymOpnd());
                if (!dst->CanStoreTemp())
                {
                    return false;
                }
                // We don't mark temp store of numeric properties (e.g. object literal { 86: foo });
                // This should only happen for InitFld, as StFld should have changed to StElem
                PropertySym *propertySym = dst->AsSymOpnd()->m_sym->AsPropertySym();
                SymID propertySymId = this->GetRepresentativePropertySymId(propertySym, backwardPass);
                return !this->nonTempSyms.Test(propertySymId) &&
                    !instr->m_func->GetThreadContextInfo()->IsNumericProperty(propertySym->m_propertyId);
            }
        };

        // All other opcode shouldn't have sym opnd that can store temp, see ObjectTemp::IsTempUseOpCodeSym.
        // We also never mark the dst indir as can store temp for StElemI_A because we don't know what property
        // it is storing in (or it could be an array index).
        Assert(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp());
    }
    return false;
}